

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O0

void __thiscall
HighsHashTree<std::pair<int,_int>,_double>::InnerLeaf<2>::move_backward
          (InnerLeaf<2> *this,int *first,int *last)

{
  HighsHashTableEntry<std::pair<int,_int>,_double> *__n;
  HighsHashTableEntry<std::pair<int,_int>,_double> *__x;
  reference __dest;
  reference __src;
  int *in_RDX;
  int *in_RSI;
  HighsHashTableEntry<std::pair<int,_int>,_double> *in_RDI;
  difference_type in_stack_ffffffffffffffc8;
  HighsHashTableEntry<std::pair<int,_int>,_double> *in_stack_ffffffffffffffd0;
  HighsHashTableEntry<std::pair<int,_int>,_double> *in_stack_ffffffffffffffe0;
  
  std::array<HighsHashTableEntry<std::pair<int,_int>,_double>,_22UL>::begin
            ((array<HighsHashTableEntry<std::pair<int,_int>,_double>,_22UL> *)0x73ce59);
  __n = std::next<HighsHashTableEntry<std::pair<int,int>,double>*>
                  (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::array<HighsHashTableEntry<std::pair<int,_int>,_double>,_22UL>::begin
            ((array<HighsHashTableEntry<std::pair<int,_int>,_double>,_22UL> *)0x73ce7e);
  __x = std::next<HighsHashTableEntry<std::pair<int,int>,double>*>
                  (in_stack_ffffffffffffffd0,(difference_type)__n);
  std::array<HighsHashTableEntry<std::pair<int,_int>,_double>,_22UL>::begin
            ((array<HighsHashTableEntry<std::pair<int,_int>,_double>,_22UL> *)0x73cea4);
  std::next<HighsHashTableEntry<std::pair<int,int>,double>*>(__x,(difference_type)__n);
  std::
  move_backward<HighsHashTableEntry<std::pair<int,int>,double>*,HighsHashTableEntry<std::pair<int,int>,double>*>
            (in_stack_ffffffffffffffe0,in_RDI,__x);
  __dest = std::array<unsigned_long,_23UL>::operator[]
                     ((array<unsigned_long,_23UL> *)__x,(size_type)__n);
  __src = std::array<unsigned_long,_23UL>::operator[]
                    ((array<unsigned_long,_23UL> *)__x,(size_type)__n);
  memmove(__dest,__src,(long)(*in_RDX - *in_RSI) << 3);
  return;
}

Assistant:

void move_backward(const int& first, const int& last) {
      // move elements backwards
      std::move_backward(std::next(entries.begin(), first),
                         std::next(entries.begin(), last),
                         std::next(entries.begin(), last + 1));
      memmove(&hashes[first + 1], &hashes[first],
              sizeof(hashes[0]) * (last - first));
    }